

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O0

int aead_xchacha20_poly1305_seal_scatter
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *out_tag,size_t *out_tag_len,
              size_t max_out_tag_len,uint8_t *nonce,size_t nonce_len,uint8_t *in,size_t in_len,
              uint8_t *extra_in,size_t extra_in_len,uint8_t *ad,size_t ad_len)

{
  uint8_t local_94 [4];
  undefined1 auStack_90 [4];
  uint8_t derived_nonce [12];
  uint8_t derived_key [32];
  aead_chacha20_poly1305_ctx *c20_ctx;
  uint8_t *nonce_local;
  size_t max_out_tag_len_local;
  size_t *out_tag_len_local;
  uint8_t *out_tag_local;
  uint8_t *out_local;
  EVP_AEAD_CTX *ctx_local;
  
  if (nonce_len == 0x18) {
    CRYPTO_hchacha20(derived_nonce + 4,(ctx->state).opaque,nonce);
    OPENSSL_memset(local_94,0,4);
    OPENSSL_memcpy(auStack_90,nonce + 0x10,8);
    ctx_local._4_4_ =
         chacha20_poly1305_seal_scatter
                   (derived_nonce + 4,out,out_tag,out_tag_len,max_out_tag_len,local_94,0xc,in,in_len
                    ,extra_in,extra_in_len,ad,ad_len,(ulong)ctx->tag_len);
  }
  else {
    ERR_put_error(0x1e,0,0x79,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0xcd);
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

static int aead_xchacha20_poly1305_seal_scatter(
    const EVP_AEAD_CTX *ctx, uint8_t *out, uint8_t *out_tag,
    size_t *out_tag_len, size_t max_out_tag_len, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *extra_in,
    size_t extra_in_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_chacha20_poly1305_ctx *c20_ctx =
      (struct aead_chacha20_poly1305_ctx *)&ctx->state;

  if (nonce_len != 24) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  alignas(4) uint8_t derived_key[32];
  alignas(4) uint8_t derived_nonce[12];
  CRYPTO_hchacha20(derived_key, c20_ctx->key, nonce);
  OPENSSL_memset(derived_nonce, 0, 4);
  OPENSSL_memcpy(&derived_nonce[4], &nonce[16], 8);

  return chacha20_poly1305_seal_scatter(
      derived_key, out, out_tag, out_tag_len, max_out_tag_len,
      derived_nonce, sizeof(derived_nonce), in, in_len, extra_in, extra_in_len,
      ad, ad_len, ctx->tag_len);
}